

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall
google::protobuf::TextFormat::Printer::PrintUnknownFields
          (Printer *this,UnknownFieldSet *unknown_fields,TextGenerator *generator,
          int recursion_budget)

{
  ZeroCopyInputStream **buffer;
  string *src;
  bool bVar1;
  char *pcVar2;
  _func_int **pp_Var3;
  undefined4 in_register_0000000c;
  undefined8 uVar4;
  long lVar5;
  pointer pUVar6;
  long lVar7;
  StringPiece text_head;
  StringPiece text_head_00;
  Hex hex;
  StringPiece text_head_01;
  StringPiece text_head_02;
  Hex hex_00;
  StringPiece text_head_03;
  StringPiece text_head_04;
  StringPiece text_head_05;
  StringPiece text_tail;
  StringPiece text_tail_00;
  StringPiece text_tail_01;
  StringPiece text_tail_02;
  StringPiece text_tail_03;
  StringPiece text_tail_04;
  StringPiece text_tail_05;
  string field_number;
  UnknownFieldSet embedded_unknown_fields;
  CodedInputStream input_stream;
  string local_f0;
  int local_cc;
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 local_b8 [16];
  UnknownFieldSet local_a8;
  undefined8 local_88;
  CodedInputStream local_80;
  
  local_88 = CONCAT44(in_register_0000000c,recursion_budget);
  pUVar6 = (unknown_fields->fields_).
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(unknown_fields->fields_).
                              super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar6) >> 4)) {
    buffer = &local_80.input_;
    local_cc = recursion_budget + -1;
    lVar5 = 8;
    lVar7 = 0;
    do {
      local_80.buffer_ = (uint8_t *)buffer;
      pcVar2 = FastInt32ToBufferLeft(*(int32 *)((long)pUVar6 + lVar5 + -8),(char *)buffer);
      local_80.buffer_end_ = (uint8_t *)(pcVar2 + -(long)buffer);
      local_c8 = local_b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,local_80.buffer_,local_80.buffer_end_ + (long)local_80.buffer_)
      ;
      switch(*(undefined4 *)((long)pUVar6 + lVar5 + -4)) {
      case 0:
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,local_c8,local_c0);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,": ",2);
        if (generator->insert_silent_marker_ == true) {
          generator->insert_silent_marker_ = false;
          (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,"\t ",2);
        }
        if (*(int *)((long)pUVar6 + lVar5 + -4) != 0) {
          __assert_fail("type() == TYPE_VARINT",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.h"
                        ,0x15a,"uint64_t google::protobuf::UnknownField::varint() const");
        }
        local_80.buffer_ = (uint8_t *)buffer;
        pcVar2 = FastUInt64ToBufferLeft(*(uint64 *)((long)&pUVar6->number_ + lVar5),(char *)buffer);
        local_80.buffer_end_ = (uint8_t *)(pcVar2 + -(long)buffer);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f0,local_80.buffer_,
                   local_80.buffer_end_ + (long)local_80.buffer_);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,local_f0._M_dataplus._M_p,local_f0._M_string_length);
        break;
      case 1:
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,local_c8,local_c0);
        text_head_02.length_ = 2;
        text_head_02.ptr_ = ": ";
        text_tail_02.length_ = 2;
        text_tail_02.ptr_ = "0x";
        TextGenerator::PrintMaybeWithMarker(generator,text_head_02,text_tail_02);
        if (*(int *)((long)pUVar6 + lVar5 + -4) != 1) {
          __assert_fail("type() == TYPE_FIXED32",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.h"
                        ,0x15e,"uint32_t google::protobuf::UnknownField::fixed32() const");
        }
        hex_00.value = (ulong)*(uint *)((long)&pUVar6->number_ + lVar5);
        hex_00._8_8_ = 8;
        strings::AlphaNum::AlphaNum((AlphaNum *)&local_80,hex_00);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f0,local_80.buffer_,
                   local_80.buffer_end_ + (long)local_80.buffer_);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,local_f0._M_dataplus._M_p,local_f0._M_string_length);
        break;
      case 2:
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,local_c8,local_c0);
        text_head_00.length_ = 2;
        text_head_00.ptr_ = ": ";
        text_tail_00.length_ = 2;
        text_tail_00.ptr_ = "0x";
        TextGenerator::PrintMaybeWithMarker(generator,text_head_00,text_tail_00);
        if (*(int *)((long)pUVar6 + lVar5 + -4) != 2) {
          __assert_fail("type() == TYPE_FIXED64",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.h"
                        ,0x162,"uint64_t google::protobuf::UnknownField::fixed64() const");
        }
        hex._8_8_ = 0x10;
        hex.value = *(uint64 *)((long)&pUVar6->number_ + lVar5);
        strings::AlphaNum::AlphaNum((AlphaNum *)&local_80,hex);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f0,local_80.buffer_,
                   local_80.buffer_end_ + (long)local_80.buffer_);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,local_f0._M_dataplus._M_p,local_f0._M_string_length);
        break;
      case 3:
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,local_c8,local_c0);
        if (*(int *)((long)pUVar6 + lVar5 + -4) != 3) {
          __assert_fail("type() == TYPE_LENGTH_DELIMITED",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.h"
                        ,0x166,
                        "const std::string &google::protobuf::UnknownField::length_delimited() const"
                       );
        }
        src = *(string **)((long)&pUVar6->number_ + lVar5);
        local_80.buffer_ = (uint8_t *)(src->_M_dataplus)._M_p;
        local_80.total_bytes_read_ = (int)src->_M_string_length;
        local_80.buffer_end_ =
             (uint8_t *)((long)local_80.buffer_ + (long)local_80.total_bytes_read_);
        local_80.input_ = (ZeroCopyInputStream *)0x0;
        local_80.overflow_bytes_ = 0;
        local_80.last_tag_ = 0;
        local_80.legitimate_message_end_ = false;
        local_80.aliasing_enabled_ = false;
        local_80.buffer_size_after_limit_ = 0;
        local_80.total_bytes_limit_ = 0x7fffffff;
        local_80.extension_pool_ = (DescriptorPool *)0x0;
        local_80.extension_factory_ = (MessageFactory *)0x0;
        local_80.recursion_budget_ = (int)local_88;
        local_a8.fields_.
        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_a8.fields_.
        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_a8.fields_.
        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_80.current_limit_ = local_80.total_bytes_read_;
        local_80.recursion_limit_ = local_80.recursion_budget_;
        if (((local_80.recursion_budget_ < 1) || (src->_M_string_length == 0)) ||
           (bVar1 = UnknownFieldSet::ParseFromCodedStream(&local_a8,&local_80), !bVar1)) {
          text_head_03.length_ = 2;
          text_head_03.ptr_ = ": ";
          text_tail_03.length_ = 1;
          text_tail_03.ptr_ = "\"";
          TextGenerator::PrintMaybeWithMarker(generator,text_head_03,text_tail_03);
          CEscape(&local_f0,src);
          (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                    (generator,local_f0._M_dataplus._M_p,local_f0._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p);
          }
          pp_Var3 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator + 5;
          pcVar2 = "\"\n";
          if (this->single_line_mode_ != false) {
            pcVar2 = "\" ";
          }
        }
        else {
          if (this->single_line_mode_ == true) {
            text_head_01.length_ = 1;
            text_head_01.ptr_ = " ";
            text_tail_01.length_ = 2;
            text_tail_01.ptr_ = "{ ";
            TextGenerator::PrintMaybeWithMarker(generator,text_head_01,text_tail_01);
          }
          else {
            text_head_05.length_ = 1;
            text_head_05.ptr_ = " ";
            text_tail_05.length_ = 2;
            text_tail_05.ptr_ = "{\n";
            TextGenerator::PrintMaybeWithMarker(generator,text_head_05,text_tail_05);
            (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[2])(generator);
          }
          PrintUnknownFields(this,&local_a8,generator,local_cc);
          pp_Var3 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator;
          if (this->single_line_mode_ == true) {
            pp_Var3 = pp_Var3 + 5;
            pcVar2 = "} ";
          }
          else {
            (*pp_Var3[3])(generator);
            pp_Var3 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator + 5;
            pcVar2 = "}\n";
          }
        }
        (**pp_Var3)(generator,pcVar2,2);
        if (local_a8.fields_.
            super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_a8.fields_.
            super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          UnknownFieldSet::ClearFallback(&local_a8);
        }
        if (local_a8.fields_.
            super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a8.fields_.
                          super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        io::CodedInputStream::~CodedInputStream(&local_80);
        goto switchD_003b87da_default;
      case 4:
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,local_c8,local_c0);
        if (this->single_line_mode_ == true) {
          text_head.length_ = 1;
          text_head.ptr_ = " ";
          text_tail.length_ = 2;
          text_tail.ptr_ = "{ ";
          TextGenerator::PrintMaybeWithMarker(generator,text_head,text_tail);
        }
        else {
          text_head_04.length_ = 1;
          text_head_04.ptr_ = " ";
          text_tail_04.length_ = 2;
          text_tail_04.ptr_ = "{\n";
          TextGenerator::PrintMaybeWithMarker(generator,text_head_04,text_tail_04);
          (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[2])(generator);
        }
        if (*(int *)((long)pUVar6 + lVar5 + -4) != 4) {
          __assert_fail("type() == TYPE_GROUP",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.h"
                        ,0x16a,
                        "const UnknownFieldSet &google::protobuf::UnknownField::group() const");
        }
        PrintUnknownFields(this,*(UnknownFieldSet **)((long)&pUVar6->number_ + lVar5),generator,
                           local_cc);
        pp_Var3 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator;
        if (this->single_line_mode_ == true) {
          pp_Var3 = pp_Var3 + 5;
          uVar4 = 2;
          pcVar2 = "} ";
        }
        else {
          (*pp_Var3[3])(generator);
          pp_Var3 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator + 5;
          uVar4 = 2;
          pcVar2 = "}\n";
        }
        goto LAB_003b8b2b;
      default:
        goto switchD_003b87da_default;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      pp_Var3 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator + 5;
      pcVar2 = "\n";
      if (this->single_line_mode_ != false) {
        pcVar2 = " ";
      }
      uVar4 = 1;
LAB_003b8b2b:
      (**pp_Var3)(generator,pcVar2,uVar4);
switchD_003b87da_default:
      if (local_c8 != local_b8) {
        operator_delete(local_c8);
      }
      lVar7 = lVar7 + 1;
      pUVar6 = (unknown_fields->fields_).
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x10;
    } while (lVar7 < (int)((ulong)((long)(unknown_fields->fields_).
                                         super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar6)
                          >> 4));
  }
  return;
}

Assistant:

void TextFormat::Printer::PrintUnknownFields(
    const UnknownFieldSet& unknown_fields, TextGenerator* generator,
    int recursion_budget) const {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);
    std::string field_number = StrCat(field.number());

    switch (field.type()) {
      case UnknownField::TYPE_VARINT:
        generator->PrintString(field_number);
        generator->PrintMaybeWithMarker(": ");
        generator->PrintString(StrCat(field.varint()));
        if (single_line_mode_) {
          generator->PrintLiteral(" ");
        } else {
          generator->PrintLiteral("\n");
        }
        break;
      case UnknownField::TYPE_FIXED32: {
        generator->PrintString(field_number);
        generator->PrintMaybeWithMarker(": ", "0x");
        generator->PrintString(
            StrCat(strings::Hex(field.fixed32(), strings::ZERO_PAD_8)));
        if (single_line_mode_) {
          generator->PrintLiteral(" ");
        } else {
          generator->PrintLiteral("\n");
        }
        break;
      }
      case UnknownField::TYPE_FIXED64: {
        generator->PrintString(field_number);
        generator->PrintMaybeWithMarker(": ", "0x");
        generator->PrintString(
            StrCat(strings::Hex(field.fixed64(), strings::ZERO_PAD_16)));
        if (single_line_mode_) {
          generator->PrintLiteral(" ");
        } else {
          generator->PrintLiteral("\n");
        }
        break;
      }
      case UnknownField::TYPE_LENGTH_DELIMITED: {
        generator->PrintString(field_number);
        const std::string& value = field.length_delimited();
        // We create a CodedInputStream so that we can adhere to our recursion
        // budget when we attempt to parse the data. UnknownFieldSet parsing is
        // recursive because of groups.
        io::CodedInputStream input_stream(
            reinterpret_cast<const uint8_t*>(value.data()), value.size());
        input_stream.SetRecursionLimit(recursion_budget);
        UnknownFieldSet embedded_unknown_fields;
        if (!value.empty() && recursion_budget > 0 &&
            embedded_unknown_fields.ParseFromCodedStream(&input_stream)) {
          // This field is parseable as a Message.
          // So it is probably an embedded message.
          if (single_line_mode_) {
            generator->PrintMaybeWithMarker(" ", "{ ");
          } else {
            generator->PrintMaybeWithMarker(" ", "{\n");
            generator->Indent();
          }
          PrintUnknownFields(embedded_unknown_fields, generator,
                             recursion_budget - 1);
          if (single_line_mode_) {
            generator->PrintLiteral("} ");
          } else {
            generator->Outdent();
            generator->PrintLiteral("}\n");
          }
        } else {
          // This field is not parseable as a Message (or we ran out of
          // recursion budget). So it is probably just a plain string.
          generator->PrintMaybeWithMarker(": ", "\"");
          generator->PrintString(CEscape(value));
          if (single_line_mode_) {
            generator->PrintLiteral("\" ");
          } else {
            generator->PrintLiteral("\"\n");
          }
        }
        break;
      }
      case UnknownField::TYPE_GROUP:
        generator->PrintString(field_number);
        if (single_line_mode_) {
          generator->PrintMaybeWithMarker(" ", "{ ");
        } else {
          generator->PrintMaybeWithMarker(" ", "{\n");
          generator->Indent();
        }
        // For groups, we recurse without checking the budget. This is OK,
        // because if the groups were too deeply nested then we would have
        // already rejected the message when we originally parsed it.
        PrintUnknownFields(field.group(), generator, recursion_budget - 1);
        if (single_line_mode_) {
          generator->PrintLiteral("} ");
        } else {
          generator->Outdent();
          generator->PrintLiteral("}\n");
        }
        break;
    }
  }
}